

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Checkpoint(sqlite3 *db,int iDb,int eMode,int *pnLog,int *pnCkpt)

{
  int *piVar1;
  Btree *p;
  BtShared *pBVar2;
  Pager *pPVar3;
  sqlite3_mutex *psVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  
  iVar7 = db->nDb;
  if (iVar7 < 1) {
    iVar7 = 0;
  }
  else {
    lVar8 = 0;
    bVar6 = false;
    lVar9 = 1;
    do {
      if (iDb == 10 || (ulong)(uint)iDb << 5 == lVar8) {
        p = *(Btree **)((long)&db->aDb->pBt + lVar8);
        if (p == (Btree *)0x0) {
          iVar7 = 0;
        }
        else {
          pBVar2 = p->pBt;
          sqlite3BtreeEnter(p);
          iVar7 = 6;
          if (pBVar2->inTransaction == '\0') {
            pPVar3 = pBVar2->pPager;
            if (pPVar3->pWal == (Wal *)0x0) {
              iVar7 = 0;
            }
            else {
              iVar7 = sqlite3WalCheckpoint
                                (pPVar3->pWal,eMode,pPVar3->xBusyHandler,pPVar3->pBusyHandlerArg,
                                 (uint)pPVar3->ckptSyncFlags,pPVar3->pageSize,
                                 (u8 *)pPVar3->pTmpSpace,pnLog,pnCkpt);
            }
          }
          if (p->sharable != '\0') {
            piVar1 = &p->wantToLock;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              psVar4 = p->pBt->mutex;
              if (psVar4 != (sqlite3_mutex *)0x0) {
                (*sqlite3Config.mutex.xMutexLeave)(psVar4);
              }
              p->locked = '\0';
            }
          }
        }
        iVar10 = iVar7;
        if (iVar7 == 5) {
          iVar10 = 0;
        }
        if (iVar7 == 5) {
          bVar6 = true;
        }
        iVar7 = db->nDb;
        pnLog = (int *)0x0;
        pnCkpt = (int *)0x0;
      }
      else {
        iVar10 = 0;
      }
      if (iVar10 != 0) break;
      lVar8 = lVar8 + 0x20;
      bVar5 = lVar9 < iVar7;
      lVar9 = lVar9 + 1;
    } while (bVar5);
    iVar7 = 5;
    if (!bVar6) {
      iVar7 = iVar10;
    }
    if (iVar10 != 0) {
      iVar7 = iVar10;
    }
  }
  return iVar7;
}

Assistant:

SQLITE_PRIVATE int sqlite3Checkpoint(sqlite3 *db, int iDb, int eMode, int *pnLog, int *pnCkpt){
  int rc = SQLITE_OK;             /* Return code */
  int i;                          /* Used to iterate through attached dbs */
  int bBusy = 0;                  /* True if SQLITE_BUSY has been encountered */

  assert( sqlite3_mutex_held(db->mutex) );
  assert( !pnLog || *pnLog==-1 );
  assert( !pnCkpt || *pnCkpt==-1 );

  for(i=0; i<db->nDb && rc==SQLITE_OK; i++){
    if( i==iDb || iDb==SQLITE_MAX_ATTACHED ){
      rc = sqlite3BtreeCheckpoint(db->aDb[i].pBt, eMode, pnLog, pnCkpt);
      pnLog = 0;
      pnCkpt = 0;
      if( rc==SQLITE_BUSY ){
        bBusy = 1;
        rc = SQLITE_OK;
      }
    }
  }

  return (rc==SQLITE_OK && bBusy) ? SQLITE_BUSY : rc;
}